

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBColorTableRow_X86(uint8_t *dst_argb,uint8_t *table_argb,int width)

{
  bool bVar1;
  int iVar2;
  
  do {
    *dst_argb = table_argb[(ulong)*dst_argb * 4];
    dst_argb[1] = table_argb[(ulong)dst_argb[1] * 4 + 1];
    dst_argb[2] = table_argb[(ulong)dst_argb[2] * 4 + 2];
    dst_argb[3] = table_argb[(ulong)dst_argb[3] * 4 + 3];
    iVar2 = width + -1;
    bVar1 = 0 < width;
    dst_argb = dst_argb + 4;
    width = iVar2;
  } while (iVar2 != 0 && bVar1);
  return;
}

Assistant:

void ARGBColorTableRow_X86(uint8_t* dst_argb,
                           const uint8_t* table_argb,
                           int width) {
  uintptr_t pixel_temp;
  asm volatile(
      // 1 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movzb       (%0),%1                       \n"
      "lea         0x4(%0),%0                    \n"
      "movzb       0x00(%3,%1,4),%1              \n"
      "mov         %b1,-0x4(%0)                  \n"
      "movzb       -0x3(%0),%1                   \n"
      "movzb       0x01(%3,%1,4),%1              \n"
      "mov         %b1,-0x3(%0)                  \n"
      "movzb       -0x2(%0),%1                   \n"
      "movzb       0x02(%3,%1,4),%1              \n"
      "mov         %b1,-0x2(%0)                  \n"
      "movzb       -0x1(%0),%1                   \n"
      "movzb       0x03(%3,%1,4),%1              \n"
      "mov         %b1,-0x1(%0)                  \n"
      "dec         %2                            \n"
      "jg          1b                            \n"
      : "+r"(dst_argb),     // %0
        "=&d"(pixel_temp),  // %1
        "+r"(width)         // %2
      : "r"(table_argb)     // %3
      : "memory", "cc");
}